

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PeptData::GenCleavageSites(PeptData *this,char *compact_sequence,size_t sequence_length)

{
  runtime_error *this_00;
  ulong in_RCX;
  long in_RDX;
  value_type_conflict1 *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cleavage_sites;
  value_type_conflict1 *in_stack_ffffffffffffffa8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  uint local_38;
  
  this_01 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x153c29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (in_RDI,in_stack_ffffffffffffffa8);
  if (*in_RSI == 0) {
    for (local_38 = 1; local_38 < in_RCX; local_38 = local_38 + 1) {
      if (((*(char *)(in_RDX + (ulong)(local_38 - 1)) == 'K') ||
          (*(char *)(in_RDX + (ulong)(local_38 - 1)) == 'R')) &&
         (*(char *)(in_RDX + (ulong)local_38) != 'P')) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,in_RSI);
      }
    }
    return in_RDI;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Enzyme type is not supported.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<unsigned> GenCleavageSites(const char* compact_sequence, size_t sequence_length) const {
        std::vector<unsigned> cleavage_sites;
        cleavage_sites.push_back(0);
        switch (enzyme_type_) {  // to support more enzymes, simply add different cleavage rules here
        case EnzymeType::Trypsin:  // Trypsin KR
            for (unsigned index = 1; index < sequence_length; ++index) {
                if ((compact_sequence[index - 1] == 'K' || compact_sequence[index - 1] == 'R')
                    && compact_sequence[index] != 'P') {
                    cleavage_sites.push_back(index);
                }
            }
            break;
        default:
            throw std::runtime_error("Enzyme type is not supported.");
        }
        return cleavage_sites;
    }